

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O1

void __thiscall nv::Kernel2::Kernel2(Kernel2 *this,Kernel2 *k)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = k->m_windowSize;
  this->m_windowSize = uVar1;
  uVar5 = uVar1 * uVar1;
  pfVar3 = (float *)operator_new__((ulong)uVar5 * 4);
  this->m_data = pfVar3;
  if (uVar5 != 0) {
    pfVar2 = k->m_data;
    uVar4 = 0;
    do {
      pfVar3[uVar4] = pfVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  return;
}

Assistant:

Kernel2::Kernel2(const Kernel2 & k) : m_windowSize(k.m_windowSize)
{
	m_data = new float[m_windowSize * m_windowSize];
	for (uint i = 0; i < m_windowSize * m_windowSize; i++) {
		m_data[i] = k.m_data[i];
	}
}